

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

particle_t * JitterParticle(int ttl,double drift)

{
  ulong uVar1;
  WORD WVar2;
  uint uVar3;
  int iVar4;
  particle_t *ppVar5;
  
  WVar2 = InactiveParticles;
  if (InactiveParticles == 0xffff) {
    ppVar5 = (particle_t *)0x0;
  }
  else {
    uVar1 = (ulong)InactiveParticles;
    ppVar5 = Particles + uVar1;
    InactiveParticles = Particles[uVar1].tnext;
    Particles[uVar1].tnext = ActiveParticles;
    ActiveParticles = WVar2;
  }
  if (ppVar5 != (particle_t *)0x0) {
    iVar4 = 3;
    do {
      uVar3 = FRandom::GenRand32(&M_Random);
      (&(ppVar5->Vel).Y)[iVar4 != 1] = (double)(int)((uVar3 & 0xff) - 0x80) * 0.000244140625 * drift
      ;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    iVar4 = 3;
    do {
      uVar3 = FRandom::GenRand32(&M_Random);
      (&(ppVar5->Acc).Y)[iVar4 != 1] =
           (double)(int)((uVar3 & 0xff) - 0x80) * 6.103515625e-05 * drift;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    ppVar5->trans = 0xff;
    ppVar5->ttl = (BYTE)ttl;
    ppVar5->fade = (BYTE)(0xff / (long)ttl);
  }
  return ppVar5;
}

Assistant:

particle_t *JitterParticle (int ttl, double drift)
{
	particle_t *particle = NewParticle ();

	if (particle) {
		int i;

		// Set initial velocities
		for (i = 3; i; i--)
			particle->Vel[i] = ((1./4096) * (M_Random () - 128) * drift);
		// Set initial accelerations
		for (i = 3; i; i--)
			particle->Acc[i] = ((1./16384) * (M_Random () - 128) * drift);

		particle->trans = 255;	// fully opaque
		particle->ttl = ttl;
		particle->fade = FADEFROMTTL(ttl);
	}
	return particle;
}